

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

int anon_unknown.dwarf_f6ec::extract_job_number(string *command,string *jobString)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  unsigned_long numJobs;
  
  numJobs = 0;
  if (jobString->_M_string_length == 0) {
    numJobs = 0;
  }
  else {
    bVar1 = cmStrToULong(jobString,&numJobs);
    if (bVar1) {
      if (numJobs == 0) {
        poVar3 = (ostream *)&std::cerr;
        pcVar2 = "The <jobs> value requires a positive integer argument.\n\n";
      }
      else {
        if (numJobs >> 0x1f == 0) goto LAB_0017f04b;
        poVar3 = (ostream *)&std::cerr;
        pcVar2 = "The <jobs> value is too large.\n\n";
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"\'");
      poVar3 = std::operator<<(poVar3,(string *)command);
      poVar3 = std::operator<<(poVar3,"\' invalid number \'");
      poVar3 = std::operator<<(poVar3,(string *)jobString);
      pcVar2 = "\' given.\n\n";
    }
    std::operator<<(poVar3,pcVar2);
    numJobs = 0xffffffffffffffff;
  }
LAB_0017f04b:
  return (int)numJobs;
}

Assistant:

int extract_job_number(std::string const& command,
                       std::string const& jobString)
{
  int jobs = -1;
  unsigned long numJobs = 0;
  if (jobString.empty()) {
    jobs = cmake::DEFAULT_BUILD_PARALLEL_LEVEL;
  } else if (cmStrToULong(jobString, &numJobs)) {
    if (numJobs == 0) {
      std::cerr
        << "The <jobs> value requires a positive integer argument.\n\n";
    } else if (numJobs > INT_MAX) {
      std::cerr << "The <jobs> value is too large.\n\n";
    } else {
      jobs = static_cast<int>(numJobs);
    }
  } else {
    std::cerr << "'" << command << "' invalid number '" << jobString
              << "' given.\n\n";
  }
  return jobs;
}